

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype QtPrivate::count(QLatin1StringView haystack,QLatin1StringView needle,CaseSensitivity cs)

{
  QLatin1StringView pattern;
  QLatin1StringView haystack_00;
  char *in_RDX;
  qsizetype in_RSI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype num;
  QLatin1StringMatcher matcher;
  QLatin1StringMatcher *in_stack_fffffffffffffd78;
  qsizetype from;
  QLatin1StringMatcher *this;
  undefined1 local_228 [544];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QLatin1StringMatcher *)0x0;
  from = -1;
  memset(local_228,0xaa,0x220);
  pattern.m_data = (char *)this;
  pattern.m_size = from;
  QLatin1StringMatcher::QLatin1StringMatcher(in_stack_fffffffffffffd78,pattern,CaseInsensitive);
  while( true ) {
    haystack_00.m_data = in_RDX;
    haystack_00.m_size = in_RSI;
    from = QLatin1StringMatcher::indexIn(this,haystack_00,from);
    if (from == -1) break;
    this = (QLatin1StringMatcher *)((long)&(this->m_pattern).m_size + 1);
  }
  QLatin1StringMatcher::~QLatin1StringMatcher((QLatin1StringMatcher *)0x51e6c6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (qsizetype)this;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::count(QLatin1StringView haystack, QLatin1StringView needle, Qt::CaseSensitivity cs)
{
    qsizetype num = 0;
    qsizetype i = -1;

    QLatin1StringMatcher matcher(needle, cs);
    while ((i = matcher.indexIn(haystack, i + 1)) != -1)
        ++num;

    return num;
}